

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O1

void __thiscall
betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::finished
          (betti_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          bool with_cell_counts)

{
  ushort uVar1;
  ushort uVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  int iVar6;
  undefined7 in_register_00000031;
  size_type __new_size;
  long lVar7;
  long lVar8;
  long lVar9;
  unsigned_long local_a8;
  int local_9c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> number_of_cells;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = ((long)(this->complex->cell_count).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->complex->cell_count).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) - 1;
  if (uVar5 < total_top_dimension) {
    uVar5 = total_top_dimension;
  }
  iVar6 = (int)CONCAT71(in_register_00000031,with_cell_counts);
  total_top_dimension = uVar5;
  if (iVar6 == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&total_cell_count,0);
  }
  else {
    puVar4 = (this->complex->cell_count).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    uVar5 = 0;
    local_9c = iVar6;
    do {
      local_a8 = *(unsigned_long *)((long)puVar4 + (lVar9 >> 0x1d));
      if (number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&number_of_cells,
                   (iterator)
                   number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_a8);
      }
      else {
        *number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_a8;
        number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar5 = uVar5 + 1;
      puVar4 = (this->complex->cell_count).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      __new_size = (long)(this->complex->cell_count).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
      lVar9 = lVar9 + 0x100000000;
    } while (uVar5 <= __new_size - 1);
    local_a8 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&total_cell_count,__new_size,&local_a8);
    puVar3 = total_cell_count.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->complex->cell_count).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = (long)(this->complex->cell_count).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar4 >> 3;
    lVar7 = 0;
    lVar8 = 0;
    with_cell_counts = SUB41(local_9c,0);
    do {
      puVar3[lVar8] = puVar3[lVar8] + *(long *)((long)puVar4 + (lVar7 >> 0x1d));
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x100000000;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar8);
  }
  uVar1 = this->min_dimension;
  uVar2 = this->max_dimension;
  puVar4 = (this->complex->cell_count).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (this->complex->cell_count).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_60,&number_of_cells);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_78,&this->betti);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,&this->skipped);
  print_ordinary((ostream *)
                 &(this->
                  super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
                  ).outstream,(uint)uVar1,(uint)uVar2,
                 (int)((ulong)((long)puVar4 - (long)puVar3) >> 3) + -1,&local_60,&local_78,&local_48
                 ,this->approximate_computation,with_cell_counts);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_a8 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&total_betti,
             (long)(this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_a8);
  puVar3 = total_betti.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)(this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar7 = 0;
    do {
      puVar3[lVar7] = puVar3[lVar7] + puVar4[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar7);
  }
  local_a8 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&total_skipped,
             (long)(this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,&local_a8);
  puVar3 = total_skipped.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar9 = (long)(this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    lVar7 = 0;
    do {
      puVar3[lVar7] = puVar3[lVar7] + puVar4[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar7);
  }
  if (number_of_cells.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(number_of_cells.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)number_of_cells.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)number_of_cells.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void betti_output_t<Complex>::finished(bool with_cell_counts) {
	std::vector<size_t> number_of_cells;
	total_top_dimension = std::max(total_top_dimension, complex->top_dimension());

	if (with_cell_counts) {
		for (auto i = 0ul; i <= complex->top_dimension(); i++) number_of_cells.push_back(complex->number_of_cells(i));

		total_cell_count.resize(complex->top_dimension() + 1, 0);
		for (auto i = 0ul; i <= complex->top_dimension(); i++) total_cell_count[i] += complex->number_of_cells(i);
	} else {
		total_cell_count.resize(0);
	}

	print_ordinary(file_output_t<Complex>::outstream, int(min_dimension), int(max_dimension),
	               int(complex->top_dimension()), number_of_cells, betti, skipped, approximate_computation,
	               with_cell_counts);

	total_betti.resize(betti.size(), 0);
	for (size_t idx = 0; idx < betti.size(); idx++) total_betti[idx] += betti[idx];

	total_skipped.resize(skipped.size(), 0);
	for (size_t idx = 0; idx < skipped.size(); idx++) total_skipped[idx] += skipped[idx];
}